

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torturethread.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  long lVar3;
  SDL_Thread *threads [10];
  long local_68 [10];
  
  iVar1 = SDL_Init(0);
  if (iVar1 < 0) {
    main_cold_2();
    iVar1 = 1;
  }
  else {
    lVar3 = 0;
    signal(0xb,(__sighandler_t)0x0);
    do {
      time_for_threads_to_die[lVar3] = '\0';
      lVar2 = SDL_CreateThread(ThreadFunc,lVar3);
      local_68[lVar3] = lVar2;
      if (lVar2 == 0) {
        main_cold_1();
        halt_baddata();
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    lVar3 = 0;
    do {
      time_for_threads_to_die[lVar3] = '\x01';
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    lVar3 = 0;
    do {
      SDL_WaitThread(local_68[lVar3],0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    SDL_Quit();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Thread *threads[NUMTHREADS];
	int i;

	/* Load the SDL library */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	signal(SIGSEGV, SIG_DFL);
	for(i = 0; i < NUMTHREADS; i++) {
		time_for_threads_to_die[i] = 0;
		threads[i] = SDL_CreateThread(ThreadFunc, (void *)(uintptr_t)i);
	
		if ( threads[i] == NULL ) {
			fprintf(stderr,
			"Couldn't create thread: %s\n", SDL_GetError());
			quit(1);
		}
	}

	for(i = 0; i < NUMTHREADS; i++) {
		time_for_threads_to_die[i] = 1;
	}

	for(i = 0; i < NUMTHREADS; i++) {
		SDL_WaitThread(threads[i], NULL);
	}
	SDL_Quit();
	return(0);
}